

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

PtrTokenOrSyntax * __thiscall
slang::syntax::ImplicitAnsiPortSyntax::getChildPtr
          (PtrTokenOrSyntax *__return_storage_ptr__,ImplicitAnsiPortSyntax *this,size_t index)

{
  PtrTokenOrSyntax *pPVar1;
  
  if (this == (ImplicitAnsiPortSyntax *)0x2) {
    pPVar1 = *(PtrTokenOrSyntax **)
              ((long)&__return_storage_ptr__[5].
                      super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                      super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                      super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                      .
                      super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                      .super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                      super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                      super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
              + 8);
  }
  else if (this == (ImplicitAnsiPortSyntax *)0x1) {
    pPVar1 = *(PtrTokenOrSyntax **)
              &__return_storage_ptr__[5].
               super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>;
  }
  else {
    if (this != (ImplicitAnsiPortSyntax *)0x0) {
      return (PtrTokenOrSyntax *)0x0;
    }
    pPVar1 = __return_storage_ptr__ + 2;
  }
  return pPVar1;
}

Assistant:

PtrTokenOrSyntax ImplicitAnsiPortSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return header.get();
        case 2: return declarator.get();
        default: return nullptr;
    }
}